

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_window_constraints.c
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  ulong uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 in_XMM1_Qa;
  _Bool constr_max_h;
  _Bool constr_max_w;
  _Bool constr_min_h;
  _Bool constr_min_w;
  int ret_max_h;
  int ret_max_w;
  int ret_min_h;
  int ret_min_w;
  int max_h;
  int max_w;
  int min_h;
  int min_w;
  _Bool redraw;
  ALLEGRO_EVENT event;
  ALLEGRO_EVENT_QUEUE *queue;
  ALLEGRO_FONT *f;
  ALLEGRO_BITMAP *bmp;
  ALLEGRO_DISPLAY *display;
  undefined4 local_184;
  undefined4 local_17c;
  undefined4 local_174;
  undefined4 local_16c;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_80;
  byte local_79;
  int local_78 [2];
  undefined8 local_70;
  int local_58;
  undefined8 local_30;
  long local_28;
  long local_20;
  long local_18;
  undefined4 local_4;
  
  local_4 = 0;
  uVar12 = al_install_system(0x5020700,atexit);
  if ((uVar12 & 1) == 0) {
    abort_example("Could not init Allegro.\n");
  }
  al_install_keyboard();
  al_init_image_addon();
  al_init_font_addon();
  al_set_new_display_flags(0x50);
  local_18 = al_create_display(0x280,0x1e0);
  if (local_18 == 0) {
    abort_example("Unable to set any graphic mode\n");
  }
  local_20 = al_load_bitmap("data/mysha.pcx");
  if (local_20 == 0) {
    abort_example("Unable to load image\n");
  }
  local_28 = al_load_font("data/a4_font.tga",0);
  if (local_28 == 0) {
    abort_example("Failed to load a4_font.tga\n");
  }
  local_80 = 0x280;
  local_84 = 0x1e0;
  local_88 = 800;
  local_8c = 600;
  bVar5 = true;
  bVar4 = true;
  bVar3 = true;
  bVar2 = true;
  uVar12 = al_set_window_constraints(local_18,0x280,0x1e0,800,600);
  if ((uVar12 & 1) == 0) {
    abort_example("Unable to set window constraints.\n");
  }
  al_apply_window_constraints(local_18,1);
  uVar13 = al_create_event_queue();
  local_30 = uVar13;
  uVar14 = al_get_display_event_source(local_18);
  al_register_event_source(uVar13,uVar14);
  uVar13 = local_30;
  uVar14 = al_get_keyboard_event_source();
  al_register_event_source(uVar13,uVar14);
  local_79 = 1;
  do {
    if (((local_79 & 1) != 0) && (uVar12 = al_is_event_queue_empty(local_30), (uVar12 & 1) != 0)) {
      uVar13 = al_map_rgb(0xff,0);
      al_clear_to_color(uVar13,in_XMM1_Qa);
      lVar1 = local_20;
      iVar6 = al_get_bitmap_width();
      iVar7 = al_get_bitmap_height(local_20);
      iVar8 = al_get_display_width(local_18);
      iVar9 = al_get_display_height(local_18);
      in_XMM1_Qa = 0;
      al_draw_scaled_bitmap(0,0,(float)iVar6,(float)iVar7,0,0,(float)iVar8,(float)iVar9,lVar1,0);
      lVar1 = local_28;
      uVar13 = al_map_rgb(0xff,0xff);
      uVar10 = al_get_display_width(local_18);
      uVar11 = al_get_display_height(local_18);
      al_draw_textf(uVar13,in_XMM1_Qa,0,lVar1,0,"Resolution: %dx%d",uVar10,uVar11);
      uVar12 = al_get_window_constraints(local_18,&local_90,&local_94,&local_98,&local_9c);
      if ((uVar12 & 1) == 0) {
        abort_example("Unable to get window constraints\n");
      }
      lVar1 = local_28;
      uVar13 = al_map_rgb(0xff,0xff);
      iVar6 = al_get_font_line_height(local_28);
      al_draw_textf(uVar13,in_XMM1_Qa,0,(float)iVar6,lVar1,0,
                    "Min Width: %d, Min Height: %d, Max Width: %d, Max Height: %d",local_90,local_94
                    ,local_98,local_9c);
      lVar1 = local_28;
      uVar13 = al_map_rgb(0xff,0xff);
      iVar6 = al_get_font_line_height(local_28);
      al_draw_textf(uVar13,in_XMM1_Qa,0,(float)(iVar6 * 2),lVar1,0,
                    "Toggle Restriction: Min Width: Z, Min Height: X, Max Width: C, Max Height: V");
      al_flip_display();
      local_79 = 0;
    }
    al_wait_for_event(local_30,local_78);
    if (local_78[0] == 0x29) {
      al_acknowledge_resize(local_70);
      local_79 = 1;
    }
    if (local_78[0] == 0x28) {
      local_79 = 1;
    }
    if (local_78[0] == 10) {
      if (local_58 == 0x3b) break;
      if (local_58 == 0x1a) {
        bVar2 = (bool)(bVar2 ^ 1);
      }
      else if (local_58 == 0x18) {
        bVar3 = (bool)(bVar3 ^ 1);
      }
      else if (local_58 == 3) {
        bVar4 = (bool)(bVar4 ^ 1);
      }
      else if (local_58 == 0x16) {
        bVar5 = (bool)(bVar5 ^ 1);
      }
      local_79 = 1;
      if (bVar2) {
        local_16c = local_80;
      }
      else {
        local_16c = 0;
      }
      if (bVar3) {
        local_174 = local_84;
      }
      else {
        local_174 = 0;
      }
      if (bVar4) {
        local_17c = local_88;
      }
      else {
        local_17c = 0;
      }
      if (bVar5) {
        local_184 = local_8c;
      }
      else {
        local_184 = 0;
      }
      uVar12 = al_set_window_constraints(local_18,local_16c,local_174,local_17c,local_184);
      if ((uVar12 & 1) == 0) {
        abort_example("Unable to set window constraints.\n");
      }
      al_apply_window_constraints(local_18,1);
    }
  } while (local_78[0] != 0x2a);
  al_destroy_bitmap(local_20);
  al_destroy_display(local_18);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_BITMAP *bmp;
   ALLEGRO_FONT *f;
   ALLEGRO_EVENT_QUEUE *queue;
   ALLEGRO_EVENT event;
   bool redraw;
   int min_w, min_h, max_w, max_h;
   int ret_min_w, ret_min_h, ret_max_w, ret_max_h;
   bool constr_min_w, constr_min_h, constr_max_w, constr_max_h;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   al_install_keyboard();
   al_init_image_addon();
   al_init_font_addon();

   al_set_new_display_flags(ALLEGRO_RESIZABLE |
      ALLEGRO_GENERATE_EXPOSE_EVENTS);
   display = al_create_display(640, 480);
   if (!display) {
      abort_example("Unable to set any graphic mode\n");
   }

   bmp = al_load_bitmap("data/mysha.pcx");
   if (!bmp) {
      abort_example("Unable to load image\n");
   }

   f = al_load_font("data/a4_font.tga", 0, 0);
   if (!f) {
      abort_example("Failed to load a4_font.tga\n");
   }

   min_w = 640;
   min_h = 480;
   max_w = 800;
   max_h = 600;
   constr_min_w = constr_min_h = constr_max_w = constr_max_h = true;

   if (!al_set_window_constraints(
          display,
          constr_min_w ? min_w : 0,
          constr_min_h ? min_h : 0,
          constr_max_w ? max_w : 0,
          constr_max_h ? max_h : 0)) {
      abort_example("Unable to set window constraints.\n");
   }

   al_apply_window_constraints(display, true);

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_display_event_source(display));
   al_register_event_source(queue, al_get_keyboard_event_source());

   redraw = true;
   while (true) {
      if (redraw && al_is_event_queue_empty(queue)) {
         al_clear_to_color(al_map_rgb(255, 0, 0));
         al_draw_scaled_bitmap(bmp,
            0, 0, al_get_bitmap_width(bmp), al_get_bitmap_height(bmp),
            0, 0, al_get_display_width(display), al_get_display_height(display),
            0);

         /* Display screen resolution */
         al_draw_textf(f, al_map_rgb(255, 255, 255), 0, 0, 0,
            "Resolution: %dx%d",
            al_get_display_width(display), al_get_display_height(display));

         if (!al_get_window_constraints(display, &ret_min_w, &ret_min_h,
               &ret_max_w, &ret_max_h))
         {
            abort_example("Unable to get window constraints\n");
         }

         al_draw_textf(f, al_map_rgb(255, 255, 255), 0,
            al_get_font_line_height(f), 0,
            "Min Width: %d, Min Height: %d, Max Width: %d, Max Height: %d",
            ret_min_w, ret_min_h, ret_max_w, ret_max_h);

         al_draw_textf(f, al_map_rgb(255, 255, 255), 0,
            al_get_font_line_height(f) * 2,0,
            "Toggle Restriction: Min Width: Z, Min Height: X, Max Width: C, Max Height: V");

         al_flip_display();
         redraw = false;
      }

      al_wait_for_event(queue, &event);
      if (event.type == ALLEGRO_EVENT_DISPLAY_RESIZE) {
         al_acknowledge_resize(event.display.source);
         redraw = true;
      }
      if (event.type == ALLEGRO_EVENT_DISPLAY_EXPOSE) {
         redraw = true;
      }
      if (event.type == ALLEGRO_EVENT_KEY_DOWN) {
         if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE) {
            break;
         }
         else if (event.keyboard.keycode == ALLEGRO_KEY_Z) {
            constr_min_w = ! constr_min_w;
         }
         else if (event.keyboard.keycode == ALLEGRO_KEY_X) {
            constr_min_h = ! constr_min_h;
         }
         else if (event.keyboard.keycode == ALLEGRO_KEY_C) {
            constr_max_w = ! constr_max_w;
         }
         else if (event.keyboard.keycode == ALLEGRO_KEY_V) {
            constr_max_h = ! constr_max_h;
         }

         redraw = true;

         if (!al_set_window_constraints(display,
               constr_min_w ? min_w : 0,
               constr_min_h ? min_h : 0,
               constr_max_w ? max_w : 0,
               constr_max_h ? max_h : 0)) {
            abort_example("Unable to set window constraints.\n");
         }
         al_apply_window_constraints(display, true);
      }
      if (event.type == ALLEGRO_EVENT_DISPLAY_CLOSE) {
         break;
      }
   }

   al_destroy_bitmap(bmp);
   al_destroy_display(display);

   return 0;
}